

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImVec2 CalcWindowSizeAfterConstraint(ImGuiWindow *window,ImVec2 *size_desired)

{
  float fVar1;
  ImGuiSizeCallback p_Var2;
  ImGuiContext *pIVar3;
  ImGuiWindow *this;
  uint uVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  ImVec2 IVar8;
  ImVec2 IVar9;
  float fVar10;
  float fVar11;
  float local_48;
  float fStack_44;
  ImGuiSizeCallbackData local_38;
  
  pIVar3 = GImGui;
  IVar9 = *size_desired;
  if (((GImGui->NextWindowData).Flags & 0x10) != 0) {
    fVar1 = (GImGui->NextWindowData).SizeConstraintRect.Min.x;
    fVar10 = (GImGui->NextWindowData).SizeConstraintRect.Min.y;
    fVar6 = IVar9.x;
    fVar7 = IVar9.y;
    if ((fVar1 < 0.0) || (fVar11 = (GImGui->NextWindowData).SizeConstraintRect.Max.x, fVar11 < 0.0))
    {
      fVar1 = (window->SizeFull).x;
    }
    else {
      if (fVar6 <= fVar11) {
        fVar11 = fVar6;
      }
      fVar1 = (float)(-(uint)(fVar6 < fVar1) & (uint)fVar1 | ~-(uint)(fVar6 < fVar1) & (uint)fVar11)
      ;
    }
    if ((fVar10 < 0.0) || (fVar6 = (GImGui->NextWindowData).SizeConstraintRect.Max.y, fVar6 < 0.0))
    {
      fVar10 = (window->SizeFull).y;
    }
    else {
      if (fVar7 <= fVar6) {
        fVar6 = fVar7;
      }
      fVar10 = (float)(-(uint)(fVar7 < fVar10) & (uint)fVar10 |
                      ~-(uint)(fVar7 < fVar10) & (uint)fVar6);
    }
    IVar8.y = fVar10;
    IVar8.x = fVar1;
    p_Var2 = (GImGui->NextWindowData).SizeCallback;
    if (p_Var2 != (ImGuiSizeCallback)0x0) {
      local_38.UserData = (GImGui->NextWindowData).SizeCallbackUserData;
      local_38.Pos = window->Pos;
      local_38.CurrentSize = window->SizeFull;
      local_38.DesiredSize = IVar8;
      (*p_Var2)(&local_38);
      IVar8 = local_38.DesiredSize;
    }
    IVar9.x = (float)(int)IVar8.x;
    IVar9.y = (float)(int)IVar8.y;
  }
  if ((window->Flags & 0x1000040U) == 0) {
    if ((window->DockNodeAsHost == (ImGuiDockNode *)0x0) ||
       (this = window->DockNodeAsHost->VisibleWindow, this == (ImGuiWindow *)0x0)) {
      this = window;
    }
    fVar6 = ImGuiWindow::TitleBarHeight(this);
    fVar7 = ImGuiWindow::MenuBarHeight(this);
    fVar1 = (pIVar3->Style).WindowMinSize.x;
    local_48 = IVar9.x;
    fStack_44 = IVar9.y;
    uVar4 = -(uint)(fVar1 <= local_48);
    fVar10 = (pIVar3->Style).WindowMinSize.y;
    uVar5 = -(uint)(fVar10 <= fStack_44);
    fVar11 = (float)(~uVar5 & (uint)fVar10 | (uint)fStack_44 & uVar5);
    fVar10 = (pIVar3->Style).WindowRounding + -1.0;
    fVar10 = (float)(~-(uint)(fVar10 <= 0.0) & (uint)fVar10) + fVar7 + fVar6;
    uVar5 = -(uint)(fVar10 <= fVar11);
    IVar9.y = (float)(~uVar5 & (uint)fVar10 | uVar5 & (uint)fVar11);
    IVar9.x = (float)(~uVar4 & (uint)fVar1 | uVar4 & (uint)local_48);
  }
  return IVar9;
}

Assistant:

static ImVec2 CalcWindowSizeAfterConstraint(ImGuiWindow* window, const ImVec2& size_desired)
{
    ImGuiContext& g = *GImGui;
    ImVec2 new_size = size_desired;
    if (g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasSizeConstraint)
    {
        // Using -1,-1 on either X/Y axis to preserve the current size.
        ImRect cr = g.NextWindowData.SizeConstraintRect;
        new_size.x = (cr.Min.x >= 0 && cr.Max.x >= 0) ? ImClamp(new_size.x, cr.Min.x, cr.Max.x) : window->SizeFull.x;
        new_size.y = (cr.Min.y >= 0 && cr.Max.y >= 0) ? ImClamp(new_size.y, cr.Min.y, cr.Max.y) : window->SizeFull.y;
        if (g.NextWindowData.SizeCallback)
        {
            ImGuiSizeCallbackData data;
            data.UserData = g.NextWindowData.SizeCallbackUserData;
            data.Pos = window->Pos;
            data.CurrentSize = window->SizeFull;
            data.DesiredSize = new_size;
            g.NextWindowData.SizeCallback(&data);
            new_size = data.DesiredSize;
        }
        new_size.x = IM_FLOOR(new_size.x);
        new_size.y = IM_FLOOR(new_size.y);
    }

    // Minimum size
    if (!(window->Flags & (ImGuiWindowFlags_ChildWindow | ImGuiWindowFlags_AlwaysAutoResize)))
    {
        ImGuiWindow* window_for_height = GetWindowForTitleAndMenuHeight(window);
        const float decoration_up_height = window_for_height->TitleBarHeight() + window_for_height->MenuBarHeight();
        new_size = ImMax(new_size, g.Style.WindowMinSize);
        new_size.y = ImMax(new_size.y, decoration_up_height + ImMax(0.0f, g.Style.WindowRounding - 1.0f)); // Reduce artifacts with very small windows
    }
    return new_size;
}